

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

BCPos parse_then(LexState *ls)

{
  BCPos BVar1;
  BCPos condexit;
  LexState *ls_local;
  
  lj_lex_next(ls);
  BVar1 = expr_cond(ls);
  lex_check(ls,0x113);
  parse_block(ls);
  return BVar1;
}

Assistant:

static BCPos parse_then(LexState *ls)
{
  BCPos condexit;
  lj_lex_next(ls);  /* Skip 'if' or 'elseif'. */
  condexit = expr_cond(ls);
  lex_check(ls, TK_then);
  parse_block(ls);
  return condexit;
}